

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O0

void __thiscall rsg::VariableManager::popValueScope(VariableManager *this)

{
  ConstValueRangeAccess value;
  ConstValueRangeAccess value_00;
  Variable *pVVar1;
  size_t this_00;
  bool bVar2;
  ValueScope *this_01;
  vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_> *this_02;
  reference ppVVar3;
  mapped_type *ppVVar4;
  VariableType *type;
  ValueEntry *pVVar5;
  reference ppVVar6;
  ConstValueRangeAccess local_270;
  _Self local_258;
  _Self local_250;
  Variable *local_248;
  Variable *var_1;
  ValueEntry *oldEntry_1;
  __normal_iterator<rsg::ValueEntry_*const_*,_std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>_>
  local_230;
  const_iterator valueIter_2;
  ValueEntry *local_208;
  ValueRangeAccess local_200;
  VariableType *local_1e8;
  Scalar *pSStack_1e0;
  Scalar *local_1d8;
  ConstValueRangeAccess local_1d0;
  ConstValueRangeAccess local_1b8;
  undefined1 local_1a0 [8];
  ValueRange intersectedValue;
  ValueEntry *oldEntry;
  _Self local_110;
  _Self local_108;
  _Self local_100;
  Variable *local_f8;
  Variable *var;
  ValueEntry *entry;
  __normal_iterator<rsg::ValueEntry_*const_*,_std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>_>
  local_e0;
  const_iterator valueIter_1;
  vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_> *valueEntries;
  ValueScope *scope;
  undefined1 local_c0 [8];
  reverse_iterator scopeIter;
  set<const_rsg::Variable_*,_std::less<const_rsg::Variable_*>,_std::allocator<const_rsg::Variable_*>_>
  addedVars;
  Variable *local_80;
  __normal_iterator<rsg::ValueEntry_*const_*,_std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>_>
  local_78;
  __normal_iterator<rsg::ValueEntry_*const_*,_std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>_>
  local_70;
  const_iterator valueIter;
  vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_> *oldEntries;
  map<const_rsg::Variable_*,_const_rsg::ValueEntry_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
  oldValues;
  ValueScope *newTopScope;
  ValueScope *oldScope;
  VariableManager *this_local;
  
  this_01 = getCurValueScope(this);
  std::vector<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>::pop_back
            (&this->m_valueScopeStack);
  std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::clear
            (&this->m_entryCache);
  bVar2 = std::vector<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>::empty
                    (&this->m_valueScopeStack);
  if (!bVar2) {
    oldValues._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)getCurValueScope(this);
    std::
    map<const_rsg::Variable_*,_const_rsg::ValueEntry_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
    ::map((map<const_rsg::Variable_*,_const_rsg::ValueEntry_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
           *)&oldEntries);
    this_02 = ValueScope::getValues(this_01);
    local_70._M_current =
         (ValueEntry **)
         std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>::begin(this_02);
    while( true ) {
      local_78._M_current =
           (ValueEntry **)
           std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>::end(this_02);
      bVar2 = __gnu_cxx::operator!=(&local_70,&local_78);
      if (!bVar2) break;
      ppVVar6 = __gnu_cxx::
                __normal_iterator<rsg::ValueEntry_*const_*,_std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>_>
                ::operator*(&local_70);
      pVVar5 = *ppVVar6;
      ppVVar6 = __gnu_cxx::
                __normal_iterator<rsg::ValueEntry_*const_*,_std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>_>
                ::operator*(&local_70);
      local_80 = ValueEntry::getVariable(*ppVVar6);
      ppVVar4 = std::
                map<const_rsg::Variable_*,_const_rsg::ValueEntry_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
                ::operator[]((map<const_rsg::Variable_*,_const_rsg::ValueEntry_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
                              *)&oldEntries,&local_80);
      *ppVVar4 = pVVar5;
      __gnu_cxx::
      __normal_iterator<rsg::ValueEntry_*const_*,_std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>_>
      ::operator++(&local_70,0);
    }
    std::
    set<const_rsg::Variable_*,_std::less<const_rsg::Variable_*>,_std::allocator<const_rsg::Variable_*>_>
    ::set((set<const_rsg::Variable_*,_std::less<const_rsg::Variable_*>,_std::allocator<const_rsg::Variable_*>_>
           *)&scopeIter);
    std::vector<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>::rbegin
              ((vector<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_> *)local_c0);
    while( true ) {
      std::vector<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>::rend
                ((vector<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_> *)&scope);
      bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<rsg::ValueScope_**,_std::vector<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>_>_>
                               *)local_c0,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<rsg::ValueScope_**,_std::vector<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>_>_>
                               *)&scope);
      if (!bVar2) break;
      ppVVar3 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<rsg::ValueScope_**,_std::vector<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>_>_>
                ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<rsg::ValueScope_**,_std::vector<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>_>_>
                             *)local_c0);
      valueIter_1._M_current = (ValueEntry **)ValueScope::getValues(*ppVVar3);
      local_e0._M_current =
           (ValueEntry **)
           std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>::begin
                     ((vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_> *)
                      valueIter_1._M_current);
      while( true ) {
        entry = (ValueEntry *)
                std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>::end
                          ((vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_> *)
                           valueIter_1._M_current);
        bVar2 = __gnu_cxx::operator!=
                          (&local_e0,
                           (__normal_iterator<rsg::ValueEntry_*const_*,_std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>_>
                            *)&entry);
        if (!bVar2) break;
        ppVVar6 = __gnu_cxx::
                  __normal_iterator<rsg::ValueEntry_*const_*,_std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>_>
                  ::operator*(&local_e0);
        var = (Variable *)*ppVVar6;
        local_f8 = ValueEntry::getVariable((ValueEntry *)var);
        local_100._M_node =
             (_Base_ptr)
             std::
             set<const_rsg::Variable_*,_std::less<const_rsg::Variable_*>,_std::allocator<const_rsg::Variable_*>_>
             ::find((set<const_rsg::Variable_*,_std::less<const_rsg::Variable_*>,_std::allocator<const_rsg::Variable_*>_>
                     *)&scopeIter,&local_f8);
        local_108._M_node =
             (_Base_ptr)
             std::
             set<const_rsg::Variable_*,_std::less<const_rsg::Variable_*>,_std::allocator<const_rsg::Variable_*>_>
             ::end((set<const_rsg::Variable_*,_std::less<const_rsg::Variable_*>,_std::allocator<const_rsg::Variable_*>_>
                    *)&scopeIter);
        bVar2 = std::operator!=(&local_100,&local_108);
        if (!bVar2) {
          local_110._M_node =
               (_Base_ptr)
               std::
               map<const_rsg::Variable_*,_const_rsg::ValueEntry_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
               ::find((map<const_rsg::Variable_*,_const_rsg::ValueEntry_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
                       *)&oldEntries,&local_f8);
          oldEntry = (ValueEntry *)
                     std::
                     map<const_rsg::Variable_*,_const_rsg::ValueEntry_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
                     ::end((map<const_rsg::Variable_*,_const_rsg::ValueEntry_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
                            *)&oldEntries);
          bVar2 = std::operator!=(&local_110,(_Self *)&oldEntry);
          if (bVar2) {
            ppVVar4 = std::
                      map<const_rsg::Variable_*,_const_rsg::ValueEntry_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
                      ::operator[]((map<const_rsg::Variable_*,_const_rsg::ValueEntry_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
                                    *)&oldEntries,&local_f8);
            intersectedValue.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppVVar4;
            type = rsg::Variable::getType(local_f8);
            ValueRange::ValueRange((ValueRange *)local_1a0,type);
            ValueEntry::getValueRange(&local_1b8,(ValueEntry *)var);
            ValueEntry::getValueRange
                      (&local_1d0,
                       (ValueEntry *)
                       intersectedValue.m_max.
                       super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
            ValueRange::computeIntersection((ValueRange *)local_1a0,&local_1b8,&local_1d0);
            pVVar5 = ValueScope::findEntry
                               ((ValueScope *)
                                oldValues._M_t._M_impl.super__Rb_tree_header._M_node_count,local_f8)
            ;
            if (pVVar5 == (ValueEntry *)0x0) {
              ValueScope::allocate
                        ((ValueScope *)oldValues._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         local_f8);
            }
            this_00 = oldValues._M_t._M_impl.super__Rb_tree_header._M_node_count;
            pVVar1 = local_f8;
            ValueRange::asAccess(&local_200,(ValueRange *)local_1a0);
            local_1d8 = local_200.super_ConstValueRangeAccess.m_max;
            local_1e8 = local_200.super_ConstValueRangeAccess.m_type;
            pSStack_1e0 = local_200.super_ConstValueRangeAccess.m_min;
            value.m_min = local_200.super_ConstValueRangeAccess.m_min;
            value.m_type = local_200.super_ConstValueRangeAccess.m_type;
            value.m_max = local_200.super_ConstValueRangeAccess.m_max;
            ValueScope::setValue((ValueScope *)this_00,pVVar1,value);
            local_208 = ValueScope::findEntry
                                  ((ValueScope *)
                                   oldValues._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                   local_f8);
            std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::
            push_back(&this->m_entryCache,&local_208);
            ValueRange::~ValueRange((ValueRange *)local_1a0);
          }
          else {
            std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::
            push_back(&this->m_entryCache,(value_type *)&var);
          }
          std::
          set<const_rsg::Variable_*,_std::less<const_rsg::Variable_*>,_std::allocator<const_rsg::Variable_*>_>
          ::insert((set<const_rsg::Variable_*,_std::less<const_rsg::Variable_*>,_std::allocator<const_rsg::Variable_*>_>
                    *)&scopeIter,&local_f8);
        }
        __gnu_cxx::
        __normal_iterator<rsg::ValueEntry_*const_*,_std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>_>
        ::operator++(&local_e0,0);
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<rsg::ValueScope_**,_std::vector<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<rsg::ValueScope_**,_std::vector<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>_>_>
                    *)&valueIter_2,(int)local_c0);
    }
    local_230._M_current =
         (ValueEntry **)
         std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>::begin(this_02);
    while( true ) {
      oldEntry_1 = (ValueEntry *)
                   std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>::end(this_02);
      bVar2 = __gnu_cxx::operator!=
                        (&local_230,
                         (__normal_iterator<rsg::ValueEntry_*const_*,_std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>_>
                          *)&oldEntry_1);
      if (!bVar2) break;
      ppVVar6 = __gnu_cxx::
                __normal_iterator<rsg::ValueEntry_*const_*,_std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>_>
                ::operator*(&local_230);
      var_1 = (Variable *)*ppVVar6;
      local_248 = ValueEntry::getVariable((ValueEntry *)var_1);
      local_250._M_node =
           (_Base_ptr)
           std::
           set<const_rsg::Variable_*,_std::less<const_rsg::Variable_*>,_std::allocator<const_rsg::Variable_*>_>
           ::find((set<const_rsg::Variable_*,_std::less<const_rsg::Variable_*>,_std::allocator<const_rsg::Variable_*>_>
                   *)&scopeIter,&local_248);
      local_258._M_node =
           (_Base_ptr)
           std::
           set<const_rsg::Variable_*,_std::less<const_rsg::Variable_*>,_std::allocator<const_rsg::Variable_*>_>
           ::end((set<const_rsg::Variable_*,_std::less<const_rsg::Variable_*>,_std::allocator<const_rsg::Variable_*>_>
                  *)&scopeIter);
      bVar2 = std::operator==(&local_250,&local_258);
      pVVar1 = local_248;
      if (bVar2) {
        ValueEntry::getValueRange(&local_270,(ValueEntry *)var_1);
        value_00.m_min = local_270.m_min;
        value_00.m_type = local_270.m_type;
        value_00.m_max = local_270.m_max;
        setValue(this,pVVar1,value_00);
      }
      __gnu_cxx::
      __normal_iterator<rsg::ValueEntry_*const_*,_std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>_>
      ::operator++(&local_230,0);
    }
    std::
    set<const_rsg::Variable_*,_std::less<const_rsg::Variable_*>,_std::allocator<const_rsg::Variable_*>_>
    ::~set((set<const_rsg::Variable_*,_std::less<const_rsg::Variable_*>,_std::allocator<const_rsg::Variable_*>_>
            *)&scopeIter);
    std::
    map<const_rsg::Variable_*,_const_rsg::ValueEntry_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
    ::~map((map<const_rsg::Variable_*,_const_rsg::ValueEntry_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
            *)&oldEntries);
  }
  return;
}

Assistant:

void VariableManager::popValueScope (void)
{
	ValueScope& oldScope = getCurValueScope();

	// Pop scope and clear cache.
	m_valueScopeStack.pop_back();
	m_entryCache.clear();

	// Re-build entry cache.
	if (!m_valueScopeStack.empty())
	{
		ValueScope& newTopScope = getCurValueScope();

		// Speed up computing intersections.
		map<const Variable*, const ValueEntry*>	oldValues;
		const vector<ValueEntry*>&				oldEntries = oldScope.getValues();

		for (vector<ValueEntry*>::const_iterator valueIter = oldEntries.begin(); valueIter != oldEntries.end(); valueIter++)
			oldValues[(*valueIter)->getVariable()] = *valueIter;

		set<const Variable*> addedVars;

		// Re-build based on current stack.
		for (vector<ValueScope*>::reverse_iterator scopeIter = m_valueScopeStack.rbegin(); scopeIter != m_valueScopeStack.rend(); scopeIter++)
		{
			const ValueScope*			scope			= *scopeIter;
			const vector<ValueEntry*>&	valueEntries	= scope->getValues();

			for (vector<ValueEntry*>::const_iterator valueIter = valueEntries.begin(); valueIter != valueEntries.end(); valueIter++)
			{
				const ValueEntry*	entry	= *valueIter;
				const Variable*		var		= entry->getVariable();

				if (addedVars.find(var) != addedVars.end())
					continue; // Already in cache, set deeper in scope stack.

				DE_ASSERT(std::find(m_entryCache.begin(), m_entryCache.end(), CompareEntryVariable(var)) == m_entryCache.end());

				if (oldValues.find(var) != oldValues.end())
				{
					const ValueEntry* oldEntry = oldValues[var];

					// Build new intersected value and store into current scope.
					ValueRange intersectedValue(var->getType());
					DE_ASSERT(oldEntry->getValueRange().intersects(entry->getValueRange())); // Must intersect
					ValueRange::computeIntersection(intersectedValue, entry->getValueRange(), oldEntry->getValueRange());

					if (!newTopScope.findEntry(var))
						newTopScope.allocate(var);

					newTopScope.setValue(var, intersectedValue.asAccess());

					// Add entry from top scope to cache.
					m_entryCache.push_back(newTopScope.findEntry(var));
				}
				else
					m_entryCache.push_back(entry); // Just add to cache.

				addedVars.insert(var); // Record as cached variable.
			}
		}

		// Copy entries from popped scope that don't yet exist in the stack.
		for (vector<ValueEntry*>::const_iterator valueIter = oldEntries.begin(); valueIter != oldEntries.end(); valueIter++)
		{
			const ValueEntry*	oldEntry	= *valueIter;
			const Variable*		var			= oldEntry->getVariable();

			if (addedVars.find(var) == addedVars.end())
				setValue(var, oldEntry->getValueRange());
		}
	}
}